

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx2::ConeCurveMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Geometry *pGVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  int iVar65;
  ulong uVar66;
  ulong uVar67;
  Scene *pSVar68;
  bool bVar69;
  bool bVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar95;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar108;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  float fVar147;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar148;
  undefined1 auVar146 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar170;
  float fVar171;
  undefined4 uVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float in_register_0000149c;
  float fVar176;
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined4 uStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [16];
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280 [4];
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  RTCHitN local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  pSVar68 = context->scene;
  local_280[0] = line->sharedGeomID;
  uVar5 = (line->v0).field_0.i[0];
  pGVar13 = (pSVar68->geometries).items[local_280[0]].ptr;
  lVar14 = *(long *)&pGVar13[1].time_range.upper;
  p_Var15 = pGVar13[1].intersectionFilterN;
  uVar6 = (line->v0).field_0.i[1];
  uVar7 = (line->v0).field_0.i[2];
  uVar8 = (line->v0).field_0.i[4];
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar8 * (long)p_Var15);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar5 * (long)p_Var15);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[5];
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar10 * (long)p_Var15);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar6 * (long)p_Var15);
  uVar11 = (line->v0).field_0.i[6];
  auVar96._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar11 * (long)p_Var15);
  auVar96._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar7 * (long)p_Var15);
  uVar12 = (line->v0).field_0.i[7];
  auVar109._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar12 * (long)p_Var15);
  auVar109._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar9 * (long)p_Var15);
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar8 + 1) * (long)p_Var15);
  auVar143._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar5 + 1) * (long)p_Var15);
  auVar143._16_16_ = ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar10 + 1) * (long)p_Var15);
  auVar120._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar6 + 1) * (long)p_Var15);
  auVar120._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar11 + 1) * (long)p_Var15);
  auVar130._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar7 + 1) * (long)p_Var15);
  auVar130._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar12 + 1) * (long)p_Var15);
  auVar137._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar9 + 1) * (long)p_Var15);
  auVar137._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
  auVar16 = vunpcklps_avx(auVar72,auVar96);
  auVar88 = vunpckhps_avx(auVar72,auVar96);
  auVar17 = vunpcklps_avx(auVar83,auVar109);
  auVar112 = vunpckhps_avx(auVar83,auVar109);
  auVar87 = vunpcklps_avx(auVar16,auVar17);
  auVar16 = vunpckhps_avx(auVar16,auVar17);
  auVar117 = vunpcklps_avx(auVar88,auVar112);
  auVar17 = vunpckhps_avx(auVar88,auVar112);
  auVar96 = vpunpckldq_avx2(auVar143,auVar130);
  auVar112 = vpunpckhdq_avx2(auVar143,auVar130);
  auVar109 = vpunpckldq_avx2(auVar120,auVar137);
  auVar83 = vpunpckhdq_avx2(auVar120,auVar137);
  auVar120 = vpunpckldq_avx2(auVar96,auVar109);
  uVar3 = line->leftExists;
  uVar4 = line->rightExists;
  auVar88 = vpcmpeqd_avx2(auVar143,auVar143);
  auVar72 = vpcmpeqd_avx2(auVar88,(undefined1  [32])(line->primIDs).field_0);
  local_280[1] = local_280[0];
  local_280[2] = local_280[0];
  local_280[3] = local_280[0];
  uStack_270 = local_280[0];
  uStack_26c = local_280[0];
  uStack_268 = local_280[0];
  uStack_264 = local_280[0];
  fVar152 = *(float *)(ray + k * 4 + 0x80);
  local_3a0._4_4_ = fVar152;
  local_3a0._0_4_ = fVar152;
  fStack_398 = fVar152;
  fStack_394 = fVar152;
  fStack_390 = fVar152;
  fStack_38c = fVar152;
  fStack_388 = fVar152;
  register0x000013dc = fVar152;
  fVar157 = *(float *)(ray + k * 4 + 0xa0);
  local_600._4_4_ = fVar157;
  local_600._0_4_ = fVar157;
  fStack_5f8 = fVar157;
  fStack_5f4 = fVar157;
  fStack_5f0 = fVar157;
  fStack_5ec = fVar157;
  fStack_5e8 = fVar157;
  register0x000015dc = fVar157;
  local_3c0 = *(float *)(ray + k * 4 + 0xc0);
  auVar96 = vpunpckhdq_avx2(auVar96,auVar109);
  auVar71 = vfmadd231ps_fma(ZEXT432((uint)(local_3c0 * local_3c0)),_local_600,_local_600);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),_local_3a0,_local_3a0);
  auVar121._0_4_ = auVar71._0_4_;
  auVar121._4_4_ = auVar121._0_4_;
  auVar121._8_4_ = auVar121._0_4_;
  auVar121._12_4_ = auVar121._0_4_;
  auVar121._16_4_ = auVar121._0_4_;
  auVar121._20_4_ = auVar121._0_4_;
  auVar121._24_4_ = auVar121._0_4_;
  auVar121._28_4_ = auVar121._0_4_;
  auVar88 = vrcpps_avx(auVar121);
  auVar109 = vpunpckldq_avx2(auVar112,auVar83);
  auVar83 = vpunpckhdq_avx2(auVar112,auVar83);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = &DAT_3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar73._16_4_ = 0x3f800000;
  auVar73._20_4_ = 0x3f800000;
  auVar73._24_4_ = 0x3f800000;
  auVar73._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar121,auVar88,auVar73);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar88,auVar88);
  auVar18._4_4_ = (auVar120._4_4_ + auVar87._4_4_) * 0.5;
  auVar18._0_4_ = (auVar120._0_4_ + auVar87._0_4_) * 0.5;
  auVar18._8_4_ = (auVar120._8_4_ + auVar87._8_4_) * 0.5;
  auVar18._12_4_ = (auVar120._12_4_ + auVar87._12_4_) * 0.5;
  auVar18._16_4_ = (auVar120._16_4_ + auVar87._16_4_) * 0.5;
  auVar18._20_4_ = (auVar120._20_4_ + auVar87._20_4_) * 0.5;
  auVar18._24_4_ = (auVar120._24_4_ + auVar87._24_4_) * 0.5;
  auVar18._28_4_ = auVar120._28_4_ + auVar87._28_4_;
  auVar88._4_4_ = (auVar96._4_4_ + auVar16._4_4_) * 0.5;
  auVar88._0_4_ = (auVar96._0_4_ + auVar16._0_4_) * 0.5;
  auVar88._8_4_ = (auVar96._8_4_ + auVar16._8_4_) * 0.5;
  auVar88._12_4_ = (auVar96._12_4_ + auVar16._12_4_) * 0.5;
  auVar88._16_4_ = (auVar96._16_4_ + auVar16._16_4_) * 0.5;
  auVar88._20_4_ = (auVar96._20_4_ + auVar16._20_4_) * 0.5;
  auVar88._24_4_ = (auVar96._24_4_ + auVar16._24_4_) * 0.5;
  auVar88._28_4_ = auVar96._28_4_ + auVar16._28_4_;
  auVar112._4_4_ = (auVar109._4_4_ + auVar117._4_4_) * 0.5;
  auVar112._0_4_ = (auVar109._0_4_ + auVar117._0_4_) * 0.5;
  auVar112._8_4_ = (auVar109._8_4_ + auVar117._8_4_) * 0.5;
  auVar112._12_4_ = (auVar109._12_4_ + auVar117._12_4_) * 0.5;
  auVar112._16_4_ = (auVar109._16_4_ + auVar117._16_4_) * 0.5;
  auVar112._20_4_ = (auVar109._20_4_ + auVar117._20_4_) * 0.5;
  auVar112._24_4_ = (auVar109._24_4_ + auVar117._24_4_) * 0.5;
  auVar112._28_4_ = 0x3f000000;
  fVar160 = *(float *)(ray + k * 4 + 0x20);
  auVar144._4_4_ = fVar160;
  auVar144._0_4_ = fVar160;
  auVar144._8_4_ = fVar160;
  auVar144._12_4_ = fVar160;
  auVar144._16_4_ = fVar160;
  auVar144._20_4_ = fVar160;
  auVar144._24_4_ = fVar160;
  auVar144._28_4_ = fVar160;
  auVar88 = vsubps_avx(auVar88,auVar144);
  fVar163 = *(float *)(ray + k * 4 + 0x40);
  auVar153._4_4_ = fVar163;
  auVar153._0_4_ = fVar163;
  auVar153._8_4_ = fVar163;
  auVar153._12_4_ = fVar163;
  auVar153._16_4_ = fVar163;
  auVar153._20_4_ = fVar163;
  auVar153._24_4_ = fVar163;
  auVar153._28_4_ = fVar163;
  auVar112 = vsubps_avx(auVar112,auVar153);
  auVar97._4_4_ = local_3c0 * auVar112._4_4_;
  auVar97._0_4_ = local_3c0 * auVar112._0_4_;
  auVar97._8_4_ = local_3c0 * auVar112._8_4_;
  auVar97._12_4_ = local_3c0 * auVar112._12_4_;
  auVar97._16_4_ = local_3c0 * auVar112._16_4_;
  auVar97._20_4_ = local_3c0 * auVar112._20_4_;
  auVar97._24_4_ = local_3c0 * auVar112._24_4_;
  auVar97._28_4_ = auVar112._28_4_;
  auVar21 = vfmadd231ps_fma(auVar97,_local_600,auVar88);
  fVar165 = *(float *)(ray + k * 4);
  auVar131._4_4_ = fVar165;
  auVar131._0_4_ = fVar165;
  auVar131._8_4_ = fVar165;
  auVar131._12_4_ = fVar165;
  auVar131._16_4_ = fVar165;
  auVar131._20_4_ = fVar165;
  auVar131._24_4_ = fVar165;
  auVar131._28_4_ = fVar165;
  auVar88 = vsubps_avx(auVar18,auVar131);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),_local_3a0,auVar88);
  fVar171 = auVar21._0_4_ * auVar71._0_4_;
  fVar173 = auVar21._4_4_ * auVar71._4_4_;
  fVar174 = auVar21._8_4_ * auVar71._8_4_;
  fVar175 = auVar21._12_4_ * auVar71._12_4_;
  auVar122._0_4_ = fVar165 + fVar171 * fVar152;
  auVar122._4_4_ = fVar165 + fVar173 * fVar152;
  auVar122._8_4_ = fVar165 + fVar174 * fVar152;
  auVar122._12_4_ = fVar165 + fVar175 * fVar152;
  auVar122._16_4_ = fVar165 + fVar152 * 0.0;
  auVar122._20_4_ = fVar165 + fVar152 * 0.0;
  auVar122._24_4_ = fVar165 + fVar152 * 0.0;
  auVar122._28_4_ = fVar165 + 0.0;
  auVar145._0_4_ = fVar160 + fVar157 * fVar171;
  auVar145._4_4_ = fVar160 + fVar157 * fVar173;
  auVar145._8_4_ = fVar160 + fVar157 * fVar174;
  auVar145._12_4_ = fVar160 + fVar157 * fVar175;
  auVar145._16_4_ = fVar160 + fVar157 * 0.0;
  auVar145._20_4_ = fVar160 + fVar157 * 0.0;
  auVar145._24_4_ = fVar160 + fVar157 * 0.0;
  auVar145._28_4_ = fVar160 + auVar88._28_4_;
  _local_580 = ZEXT1628(CONCAT412(fVar175,CONCAT48(fVar174,CONCAT44(fVar173,fVar171))));
  fStack_564 = in_register_0000149c;
  auVar132._0_4_ = fVar163 + local_3c0 * fVar171;
  auVar132._4_4_ = fVar163 + local_3c0 * fVar173;
  auVar132._8_4_ = fVar163 + local_3c0 * fVar174;
  auVar132._12_4_ = fVar163 + local_3c0 * fVar175;
  auVar132._16_4_ = fVar163 + local_3c0 * 0.0;
  auVar132._20_4_ = fVar163 + local_3c0 * 0.0;
  auVar132._24_4_ = fVar163 + local_3c0 * 0.0;
  auVar132._28_4_ = fVar163 + auVar88._28_4_;
  local_2a0 = vsubps_avx(auVar120,auVar87);
  _local_620 = vsubps_avx(auVar122,auVar87);
  local_480 = vsubps_avx(auVar96,auVar16);
  _local_4e0 = vsubps_avx(auVar145,auVar16);
  local_4a0 = vsubps_avx(auVar109,auVar117);
  _local_460 = vsubps_avx(auVar132,auVar117);
  fVar169 = local_4a0._0_4_;
  fVar156 = local_4a0._4_4_;
  auVar16._4_4_ = fVar156 * fVar156;
  auVar16._0_4_ = fVar169 * fVar169;
  fVar164 = local_4a0._8_4_;
  auVar16._8_4_ = fVar164 * fVar164;
  fVar170 = local_4a0._12_4_;
  auVar16._12_4_ = fVar170 * fVar170;
  fVar194 = local_4a0._16_4_;
  auVar16._16_4_ = fVar194 * fVar194;
  fVar196 = local_4a0._20_4_;
  auVar16._20_4_ = fVar196 * fVar196;
  fVar198 = local_4a0._24_4_;
  auVar16._24_4_ = fVar198 * fVar198;
  auVar16._28_4_ = auVar87._28_4_;
  auVar71 = vfmadd231ps_fma(auVar16,local_480,local_480);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_2a0,local_2a0);
  fVar181 = local_460._0_4_;
  fVar184 = local_460._4_4_;
  auVar87._4_4_ = fVar184 * fVar156;
  auVar87._0_4_ = fVar181 * fVar169;
  fVar186 = local_460._8_4_;
  auVar87._8_4_ = fVar186 * fVar164;
  fVar188 = local_460._12_4_;
  auVar87._12_4_ = fVar188 * fVar170;
  fVar189 = local_460._16_4_;
  auVar87._16_4_ = fVar189 * fVar194;
  fVar190 = local_460._20_4_;
  auVar87._20_4_ = fVar190 * fVar196;
  fVar191 = local_460._24_4_;
  auVar87._24_4_ = fVar191 * fVar198;
  auVar87._28_4_ = in_register_0000149c;
  auVar21 = vfmadd231ps_fma(auVar87,_local_4e0,local_480);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),_local_620,local_2a0);
  auVar24._4_4_ = local_3c0 * fVar156;
  auVar24._0_4_ = local_3c0 * fVar169;
  auVar24._8_4_ = local_3c0 * fVar164;
  auVar24._12_4_ = local_3c0 * fVar170;
  auVar24._16_4_ = local_3c0 * fVar194;
  auVar24._20_4_ = local_3c0 * fVar196;
  auVar24._24_4_ = local_3c0 * fVar198;
  auVar24._28_4_ = fVar163;
  auVar22 = vfmadd231ps_fma(auVar24,_local_600,local_480);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),_local_3a0,local_2a0);
  auVar88 = vsubps_avx(auVar17,auVar83);
  fVar147 = auVar88._0_4_;
  fVar159 = auVar88._4_4_;
  fVar166 = auVar88._8_4_;
  fVar176 = auVar88._12_4_;
  fVar195 = auVar88._16_4_;
  fVar197 = auVar88._20_4_;
  fVar182 = auVar88._24_4_;
  fVar160 = auVar71._0_4_;
  local_400 = fVar147 * fVar147 + fVar160;
  fVar163 = auVar71._4_4_;
  fStack_3fc = fVar159 * fVar159 + fVar163;
  fVar165 = auVar71._8_4_;
  fStack_3f8 = fVar166 * fVar166 + fVar165;
  fVar167 = auVar71._12_4_;
  fStack_3f4 = fVar176 * fVar176 + fVar167;
  fStack_3f0 = fVar195 * fVar195 + 0.0;
  fStack_3ec = fVar197 * fVar197 + 0.0;
  fStack_3e8 = fVar182 * fVar182 + 0.0;
  auVar25._4_4_ = local_3c0 * fVar184;
  auVar25._0_4_ = local_3c0 * fVar181;
  auVar25._8_4_ = local_3c0 * fVar186;
  auVar25._12_4_ = local_3c0 * fVar188;
  auVar25._16_4_ = local_3c0 * fVar189;
  auVar25._20_4_ = local_3c0 * fVar190;
  auVar25._24_4_ = local_3c0 * fVar191;
  auVar25._28_4_ = local_480._28_4_;
  auVar23 = vfmadd231ps_fma(auVar25,_local_600,_local_4e0);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),_local_3a0,_local_620);
  fVar108 = fVar160 * fVar160;
  fVar114 = fVar163 * fVar163;
  fVar115 = fVar165 * fVar165;
  fVar116 = fVar167 * fVar167;
  uStack_2a4 = auVar117._28_4_;
  _local_2c0 = ZEXT1628(CONCAT412(fVar116,CONCAT48(fVar115,CONCAT44(fVar114,fVar108))));
  fVar151 = auVar21._0_4_;
  fVar150 = auVar22._0_4_;
  fVar162 = auVar21._4_4_;
  fVar155 = auVar22._4_4_;
  fVar168 = auVar21._8_4_;
  fVar158 = auVar22._8_4_;
  fVar193 = auVar21._12_4_;
  fVar161 = auVar22._12_4_;
  fVar185 = local_4a0._28_4_;
  auVar117._4_4_ = fStack_3fc * fVar155 * fVar162;
  auVar117._0_4_ = local_400 * fVar150 * fVar151;
  auVar117._8_4_ = fStack_3f8 * fVar158 * fVar168;
  auVar117._12_4_ = fStack_3f4 * fVar161 * fVar193;
  auVar117._16_4_ = fStack_3f0 * 0.0;
  auVar117._20_4_ = fStack_3ec * 0.0;
  auVar117._24_4_ = fStack_3e8 * 0.0;
  auVar117._28_4_ = fVar185;
  auVar112 = vsubps_avx(ZEXT1632(CONCAT412(fVar116 * auVar23._12_4_,
                                           CONCAT48(fVar115 * auVar23._8_4_,
                                                    CONCAT44(fVar114 * auVar23._4_4_,
                                                             fVar108 * auVar23._0_4_)))),auVar117);
  auVar117 = ZEXT1632(auVar71);
  fVar82 = auVar17._0_4_;
  fVar95 = fVar82 * fVar160;
  fVar89 = auVar17._4_4_;
  fVar102 = fVar89 * fVar163;
  auVar26._4_4_ = fVar102;
  auVar26._0_4_ = fVar95;
  fVar90 = auVar17._8_4_;
  fVar103 = fVar90 * fVar165;
  auVar26._8_4_ = fVar103;
  fVar91 = auVar17._12_4_;
  fVar104 = fVar91 * fVar167;
  auVar26._12_4_ = fVar104;
  fVar92 = auVar17._16_4_;
  fVar105 = fVar92 * 0.0;
  auVar26._16_4_ = fVar105;
  fVar93 = auVar17._20_4_;
  fVar106 = fVar93 * 0.0;
  auVar26._20_4_ = fVar106;
  fVar94 = auVar17._24_4_;
  fVar107 = fVar94 * 0.0;
  auVar26._24_4_ = fVar107;
  auVar26._28_4_ = fVar185;
  fVar187 = auVar17._28_4_;
  auVar84._0_4_ = fVar150 * fVar147 * fVar95 + auVar112._0_4_;
  auVar84._4_4_ = fVar155 * fVar159 * fVar102 + auVar112._4_4_;
  auVar84._8_4_ = fVar158 * fVar166 * fVar103 + auVar112._8_4_;
  auVar84._12_4_ = fVar161 * fVar176 * fVar104 + auVar112._12_4_;
  auVar84._16_4_ = fVar195 * 0.0 * fVar105 + auVar112._16_4_;
  auVar84._20_4_ = fVar197 * 0.0 * fVar106 + auVar112._20_4_;
  auVar84._24_4_ = fVar182 * 0.0 * fVar107 + auVar112._24_4_;
  auVar84._28_4_ = fVar187 + auVar112._28_4_;
  auVar17._4_4_ = fVar184 * fVar184;
  auVar17._0_4_ = fVar181 * fVar181;
  auVar17._8_4_ = fVar186 * fVar186;
  auVar17._12_4_ = fVar188 * fVar188;
  auVar17._16_4_ = fVar189 * fVar189;
  auVar17._20_4_ = fVar190 * fVar190;
  auVar17._24_4_ = fVar191 * fVar191;
  auVar17._28_4_ = fVar187;
  auVar71 = vfmadd231ps_fma(auVar17,_local_4e0,_local_4e0);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),_local_620,_local_620);
  fVar149 = local_620._28_4_;
  auVar27._4_4_ = fVar162 * fVar162 * fStack_3fc;
  auVar27._0_4_ = fVar151 * fVar151 * local_400;
  auVar27._8_4_ = fVar168 * fVar168 * fStack_3f8;
  auVar27._12_4_ = fVar193 * fVar193 * fStack_3f4;
  auVar27._16_4_ = fStack_3f0 * 0.0;
  auVar27._20_4_ = fStack_3ec * 0.0;
  auVar27._24_4_ = fStack_3e8 * 0.0;
  auVar27._28_4_ = fVar149;
  auVar112 = vsubps_avx(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar116,
                                           CONCAT48(auVar71._8_4_ * fVar115,
                                                    CONCAT44(auVar71._4_4_ * fVar114,
                                                             auVar71._0_4_ * fVar108)))),auVar27);
  fStack_3c4 = auVar88._28_4_;
  auVar28._4_4_ = (fVar159 + fVar159) * fVar162;
  auVar28._0_4_ = (fVar147 + fVar147) * fVar151;
  auVar28._8_4_ = (fVar166 + fVar166) * fVar168;
  auVar28._12_4_ = (fVar176 + fVar176) * fVar193;
  auVar28._16_4_ = (fVar195 + fVar195) * 0.0;
  auVar28._20_4_ = (fVar197 + fVar197) * 0.0;
  auVar28._24_4_ = (fVar182 + fVar182) * 0.0;
  auVar28._28_4_ = fStack_3c4 + fStack_3c4;
  auVar88 = vsubps_avx(auVar28,auVar26);
  fVar148 = auVar112._28_4_;
  fVar119 = fVar150 * fVar150;
  fVar127 = fVar155 * fVar155;
  fVar128 = fVar158 * fVar158;
  fVar129 = fVar161 * fVar161;
  uStack_3d0 = 0;
  uStack_3cc = 0;
  uStack_3c8 = 0;
  auVar29._4_4_ = fStack_3fc * fVar127;
  auVar29._0_4_ = local_400 * fVar119;
  auVar29._8_4_ = fStack_3f8 * fVar128;
  auVar29._12_4_ = fStack_3f4 * fVar129;
  auVar29._16_4_ = fStack_3f0 * 0.0;
  auVar29._20_4_ = fStack_3ec * 0.0;
  auVar29._24_4_ = fStack_3e8 * 0.0;
  auVar29._28_4_ = fVar148;
  auVar16 = vsubps_avx(_local_2c0,auVar29);
  auVar30._4_4_ = auVar16._4_4_ * (auVar112._4_4_ + auVar88._4_4_ * fVar102);
  auVar30._0_4_ = auVar16._0_4_ * (auVar112._0_4_ + auVar88._0_4_ * fVar95);
  auVar30._8_4_ = auVar16._8_4_ * (auVar112._8_4_ + auVar88._8_4_ * fVar103);
  auVar30._12_4_ = auVar16._12_4_ * (auVar112._12_4_ + auVar88._12_4_ * fVar104);
  auVar30._16_4_ = auVar16._16_4_ * (auVar112._16_4_ + auVar88._16_4_ * fVar105);
  auVar30._20_4_ = auVar16._20_4_ * (auVar112._20_4_ + auVar88._20_4_ * fVar106);
  auVar30._24_4_ = auVar16._24_4_ * (auVar112._24_4_ + auVar88._24_4_ * fVar107);
  auVar30._28_4_ = fVar148 + fVar185;
  auVar31._4_4_ = auVar84._4_4_ * auVar84._4_4_;
  auVar31._0_4_ = auVar84._0_4_ * auVar84._0_4_;
  auVar31._8_4_ = auVar84._8_4_ * auVar84._8_4_;
  auVar31._12_4_ = auVar84._12_4_ * auVar84._12_4_;
  auVar31._16_4_ = auVar84._16_4_ * auVar84._16_4_;
  auVar31._20_4_ = auVar84._20_4_ * auVar84._20_4_;
  auVar31._24_4_ = auVar84._24_4_ * auVar84._24_4_;
  auVar31._28_4_ = fVar148;
  auVar112 = vsubps_avx(auVar31,auVar30);
  auVar87 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar88 = vcmpps_avx(auVar112,auVar87,5);
  auVar17 = auVar88 & ~auVar72;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar88 = vandnps_avx(auVar72,auVar88);
    auVar71 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    auVar72 = vsubps_avx(auVar122,auVar120);
    auVar96 = vsubps_avx(auVar145,auVar96);
    auVar109 = vsubps_avx(auVar132,auVar109);
    auVar133._2_2_ = 0;
    auVar133._0_2_ = uVar4;
    auVar112 = vsqrtps_avx(auVar112);
    auVar133._4_2_ = uVar4;
    auVar133._6_2_ = 0;
    auVar133._8_2_ = uVar4;
    auVar133._10_2_ = 0;
    auVar133._12_2_ = uVar4;
    auVar133._14_2_ = 0;
    auVar133._16_2_ = uVar4;
    auVar133._18_2_ = 0;
    auVar133._20_2_ = uVar4;
    auVar133._22_2_ = 0;
    auVar133._24_2_ = uVar4;
    auVar133._26_2_ = 0;
    auVar133._28_2_ = uVar4;
    auVar133._30_2_ = 0;
    auVar88 = vrcpps_avx(auVar16);
    auVar138._8_4_ = 0x3f800000;
    auVar138._0_8_ = &DAT_3f8000003f800000;
    auVar138._12_4_ = 0x3f800000;
    auVar138._16_4_ = 0x3f800000;
    auVar138._20_4_ = 0x3f800000;
    auVar138._24_4_ = 0x3f800000;
    auVar138._28_4_ = 0x3f800000;
    auVar21 = vfnmadd213ps_fma(auVar88,auVar16,auVar138);
    auVar139._8_4_ = 0x7fffffff;
    auVar139._0_8_ = 0x7fffffff7fffffff;
    auVar139._12_4_ = 0x7fffffff;
    auVar139._16_4_ = 0x7fffffff;
    auVar139._20_4_ = 0x7fffffff;
    auVar139._24_4_ = 0x7fffffff;
    auVar139._28_4_ = 0x7fffffff;
    auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar88,auVar88);
    auVar88 = vandps_avx(auVar16,auVar139);
    auVar140._8_4_ = 0x219392ef;
    auVar140._0_8_ = 0x219392ef219392ef;
    auVar140._12_4_ = 0x219392ef;
    auVar140._16_4_ = 0x219392ef;
    auVar140._20_4_ = 0x219392ef;
    auVar140._24_4_ = 0x219392ef;
    auVar140._28_4_ = 0x219392ef;
    auVar88 = vcmpps_avx(auVar88,auVar140,2);
    uVar67 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
    auVar74._0_8_ = uVar67 ^ 0x8000000080000000;
    auVar74._8_4_ = -auVar84._8_4_;
    auVar74._12_4_ = -auVar84._12_4_;
    auVar74._16_4_ = -auVar84._16_4_;
    auVar74._20_4_ = -auVar84._20_4_;
    auVar74._24_4_ = -auVar84._24_4_;
    auVar74._28_4_ = -auVar84._28_4_;
    auVar16 = vsubps_avx(auVar74,auVar112);
    auVar17 = vsubps_avx(auVar112,auVar84);
    auVar123._8_4_ = 0xff800000;
    auVar123._0_8_ = 0xff800000ff800000;
    auVar123._12_4_ = 0xff800000;
    auVar123._16_4_ = 0xff800000;
    auVar123._20_4_ = 0xff800000;
    auVar123._24_4_ = 0xff800000;
    auVar123._28_4_ = 0xff800000;
    auVar32._4_4_ = auVar21._4_4_ * auVar16._4_4_;
    auVar32._0_4_ = auVar21._0_4_ * auVar16._0_4_;
    auVar32._8_4_ = auVar21._8_4_ * auVar16._8_4_;
    auVar32._12_4_ = auVar21._12_4_ * auVar16._12_4_;
    auVar32._16_4_ = auVar16._16_4_ * 0.0;
    auVar32._20_4_ = auVar16._20_4_ * 0.0;
    auVar32._24_4_ = auVar16._24_4_ * 0.0;
    auVar32._28_4_ = auVar16._28_4_;
    auVar112 = vblendvps_avx(auVar32,auVar123,auVar88);
    auVar33._4_4_ = auVar21._4_4_ * auVar17._4_4_;
    auVar33._0_4_ = auVar21._0_4_ * auVar17._0_4_;
    auVar33._8_4_ = auVar21._8_4_ * auVar17._8_4_;
    auVar33._12_4_ = auVar21._12_4_ * auVar17._12_4_;
    auVar33._16_4_ = auVar17._16_4_ * 0.0;
    auVar33._20_4_ = auVar17._20_4_ * 0.0;
    auVar33._24_4_ = auVar17._24_4_ * 0.0;
    auVar33._28_4_ = auVar17._28_4_;
    auVar192._8_4_ = 0x7f800000;
    auVar192._0_8_ = 0x7f8000007f800000;
    auVar192._12_4_ = 0x7f800000;
    auVar192._16_4_ = 0x7f800000;
    auVar192._20_4_ = 0x7f800000;
    auVar192._24_4_ = 0x7f800000;
    auVar192._28_4_ = 0x7f800000;
    auVar16 = vblendvps_avx(auVar33,auVar192,auVar88);
    auVar18 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar88 = vpand_avx2(auVar133,auVar18);
    auVar87 = vpcmpeqd_avx2(auVar88,auVar87);
    auVar21 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
    auVar75._0_4_ = fVar151 + fVar150 * auVar112._0_4_;
    auVar75._4_4_ = fVar162 + fVar155 * auVar112._4_4_;
    auVar75._8_4_ = fVar168 + fVar158 * auVar112._8_4_;
    auVar75._12_4_ = fVar193 + fVar161 * auVar112._12_4_;
    auVar75._16_4_ = auVar112._16_4_ * 0.0 + 0.0;
    auVar75._20_4_ = auVar112._20_4_ * 0.0 + 0.0;
    auVar75._24_4_ = auVar112._24_4_ * 0.0 + 0.0;
    auVar75._28_4_ = 0;
    auVar97 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar88 = vcmpps_avx(auVar75,auVar97,6);
    auVar17 = vcmpps_avx(auVar75,auVar117,1);
    auVar88 = vandps_avx(auVar17,auVar88);
    auVar23 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    auVar23 = vpand_avx(auVar23,auVar71);
    auVar120 = vpmovsxwd_avx2(auVar23);
    local_500 = vblendvps_avx(auVar192,auVar112,auVar120);
    auVar110._2_2_ = 0;
    auVar110._0_2_ = uVar3;
    auVar110._4_2_ = uVar3;
    auVar110._6_2_ = 0;
    auVar110._8_2_ = uVar3;
    auVar110._10_2_ = 0;
    auVar110._12_2_ = uVar3;
    auVar110._14_2_ = 0;
    auVar110._16_2_ = uVar3;
    auVar110._18_2_ = 0;
    auVar110._20_2_ = uVar3;
    auVar110._22_2_ = 0;
    auVar110._24_2_ = uVar3;
    auVar110._26_2_ = 0;
    auVar110._28_2_ = uVar3;
    auVar110._30_2_ = 0;
    auVar88 = vpand_avx2(auVar110,auVar18);
    auVar17 = vpcmpeqd_avx2(auVar88,auVar97);
    local_4c0._0_4_ = fVar151 + fVar150 * auVar16._0_4_;
    local_4c0._4_4_ = fVar162 + fVar155 * auVar16._4_4_;
    local_4c0._8_4_ = fVar168 + fVar158 * auVar16._8_4_;
    local_4c0._12_4_ = fVar193 + fVar161 * auVar16._12_4_;
    local_4c0._16_4_ = auVar16._16_4_ * 0.0 + 0.0;
    local_4c0._20_4_ = auVar16._20_4_ * 0.0 + 0.0;
    local_4c0._24_4_ = auVar16._24_4_ * 0.0 + 0.0;
    local_4c0._28_4_ = auVar120._28_4_ + 0.0;
    auVar88 = vcmpps_avx(local_4c0,auVar97,6);
    auVar112 = vcmpps_avx(local_4c0,auVar117,1);
    auVar88 = vandps_avx(auVar112,auVar88);
    auVar23 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    auVar23 = vpand_avx(auVar71,auVar23);
    auVar88 = vpmovsxwd_avx2(auVar23);
    local_560 = vblendvps_avx(auVar123,auVar16,auVar88);
    auVar23 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
    auVar88 = vrcpps_avx(ZEXT1632(auVar22));
    auVar76._8_4_ = 0x3f800000;
    auVar76._0_8_ = &DAT_3f8000003f800000;
    auVar76._12_4_ = 0x3f800000;
    auVar76._16_4_ = 0x3f800000;
    auVar76._20_4_ = 0x3f800000;
    auVar76._24_4_ = 0x3f800000;
    auVar76._28_4_ = 0x3f800000;
    auVar22 = vfnmadd213ps_fma(auVar88,ZEXT1632(auVar22),auVar76);
    auVar20 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar88,auVar88);
    auVar34._4_4_ = fVar155 * (float)local_620._4_4_;
    auVar34._0_4_ = fVar150 * (float)local_620._0_4_;
    auVar34._8_4_ = fVar158 * fStack_618;
    auVar34._12_4_ = fVar161 * fStack_614;
    auVar34._16_4_ = fStack_610 * 0.0;
    auVar34._20_4_ = fStack_60c * 0.0;
    auVar34._24_4_ = fStack_608 * 0.0;
    auVar34._28_4_ = auVar88._28_4_;
    auVar179._0_4_ = fVar151 * fVar152;
    auVar179._4_4_ = fVar162 * fVar152;
    auVar179._8_4_ = fVar168 * fVar152;
    auVar179._12_4_ = fVar193 * fVar152;
    auVar179._16_4_ = fVar152 * 0.0;
    auVar179._20_4_ = fVar152 * 0.0;
    auVar179._24_4_ = fVar152 * 0.0;
    auVar179._28_4_ = 0;
    auVar88 = vsubps_avx(auVar34,auVar179);
    auVar35._4_4_ = fVar155 * (float)local_4e0._4_4_;
    auVar35._0_4_ = fVar150 * (float)local_4e0._0_4_;
    auVar35._8_4_ = fVar158 * fStack_4d8;
    auVar35._12_4_ = fVar161 * fStack_4d4;
    auVar35._16_4_ = fStack_4d0 * 0.0;
    auVar35._20_4_ = fStack_4cc * 0.0;
    auVar35._24_4_ = fStack_4c8 * 0.0;
    auVar35._28_4_ = 0;
    auVar183._0_4_ = fVar157 * fVar151;
    auVar183._4_4_ = fVar157 * fVar162;
    auVar183._8_4_ = fVar157 * fVar168;
    auVar183._12_4_ = fVar157 * fVar193;
    auVar183._16_4_ = fVar157 * 0.0;
    auVar183._20_4_ = fVar157 * 0.0;
    auVar183._24_4_ = fVar157 * 0.0;
    auVar183._28_4_ = 0;
    auVar112 = vsubps_avx(auVar35,auVar183);
    auVar36._4_4_ = fVar155 * fVar184;
    auVar36._0_4_ = fVar150 * fVar181;
    auVar36._8_4_ = fVar158 * fVar186;
    auVar36._12_4_ = fVar161 * fVar188;
    auVar36._16_4_ = fVar189 * 0.0;
    auVar36._20_4_ = fVar190 * 0.0;
    auVar36._24_4_ = fVar191 * 0.0;
    auVar36._28_4_ = 0;
    auVar37._4_4_ = fVar162 * local_3c0;
    auVar37._0_4_ = fVar151 * local_3c0;
    auVar37._8_4_ = fVar168 * local_3c0;
    auVar37._12_4_ = fVar193 * local_3c0;
    auVar37._16_4_ = local_3c0 * 0.0;
    auVar37._20_4_ = local_3c0 * 0.0;
    auVar37._24_4_ = local_3c0 * 0.0;
    auVar37._28_4_ = auVar87._28_4_;
    auVar16 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar16._4_4_ * auVar16._4_4_;
    auVar38._0_4_ = auVar16._0_4_ * auVar16._0_4_;
    auVar38._8_4_ = auVar16._8_4_ * auVar16._8_4_;
    auVar38._12_4_ = auVar16._12_4_ * auVar16._12_4_;
    auVar38._16_4_ = auVar16._16_4_ * auVar16._16_4_;
    auVar38._20_4_ = auVar16._20_4_ * auVar16._20_4_;
    auVar38._24_4_ = auVar16._24_4_ * auVar16._24_4_;
    auVar38._28_4_ = auVar16._28_4_;
    auVar22 = vfmadd231ps_fma(auVar38,auVar112,auVar112);
    auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar88,auVar88);
    auVar39._4_4_ = fVar89 * fVar89 * fVar127;
    auVar39._0_4_ = fVar82 * fVar82 * fVar119;
    auVar39._8_4_ = fVar90 * fVar90 * fVar128;
    auVar39._12_4_ = fVar91 * fVar91 * fVar129;
    auVar39._16_4_ = fVar92 * fVar92 * 0.0;
    auVar39._20_4_ = fVar93 * fVar93 * 0.0;
    auVar39._24_4_ = fVar94 * fVar94 * 0.0;
    auVar39._28_4_ = fVar187;
    auVar88 = vcmpps_avx(ZEXT1632(auVar22),auVar39,1);
    auVar22 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    auVar22 = vpand_avx(auVar23,auVar22);
    auVar40._4_4_ = auVar20._4_4_ * -fVar162;
    auVar40._0_4_ = auVar20._0_4_ * -fVar151;
    auVar40._8_4_ = auVar20._8_4_ * -fVar168;
    auVar40._12_4_ = auVar20._12_4_ * -fVar193;
    auVar40._16_4_ = 0x80000000;
    auVar40._20_4_ = 0x80000000;
    auVar40._24_4_ = 0x80000000;
    auVar40._28_4_ = 0x80000000;
    auVar22 = vpand_avx(auVar71,auVar22);
    auVar88 = vpmovsxwd_avx2(auVar22);
    local_5e0 = vblendvps_avx(auVar192,auVar40,auVar88);
    local_5a0._0_4_ = auVar109._0_4_;
    local_5a0._4_4_ = auVar109._4_4_;
    fStack_598 = auVar109._8_4_;
    fStack_594 = auVar109._12_4_;
    fStack_590 = auVar109._16_4_;
    fStack_58c = auVar109._20_4_;
    fStack_588 = auVar109._24_4_;
    uStack_584 = auVar109._28_4_;
    auVar41._4_4_ = (float)local_5a0._4_4_ * fVar156;
    auVar41._0_4_ = (float)local_5a0._0_4_ * fVar169;
    auVar41._8_4_ = fStack_598 * fVar164;
    auVar41._12_4_ = fStack_594 * fVar170;
    auVar41._16_4_ = fStack_590 * fVar194;
    auVar41._20_4_ = fStack_58c * fVar196;
    auVar41._24_4_ = fStack_588 * fVar198;
    auVar41._28_4_ = 0x80000000;
    auVar22 = vfmadd231ps_fma(auVar41,auVar96,local_480);
    auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar72,local_2a0);
    auVar42._4_4_ = fVar155 * auVar72._4_4_;
    auVar42._0_4_ = fVar150 * auVar72._0_4_;
    auVar42._8_4_ = fVar158 * auVar72._8_4_;
    auVar42._12_4_ = fVar161 * auVar72._12_4_;
    auVar42._16_4_ = auVar72._16_4_ * 0.0;
    auVar42._20_4_ = auVar72._20_4_ * 0.0;
    auVar42._24_4_ = auVar72._24_4_ * 0.0;
    auVar42._28_4_ = auVar72._28_4_;
    auVar43._4_4_ = fVar155 * auVar96._4_4_;
    auVar43._0_4_ = fVar150 * auVar96._0_4_;
    auVar43._8_4_ = fVar158 * auVar96._8_4_;
    auVar43._12_4_ = fVar161 * auVar96._12_4_;
    auVar43._16_4_ = auVar96._16_4_ * 0.0;
    auVar43._20_4_ = auVar96._20_4_ * 0.0;
    auVar43._24_4_ = auVar96._24_4_ * 0.0;
    auVar43._28_4_ = auVar96._28_4_;
    auVar44._4_4_ = fVar155 * (float)local_5a0._4_4_;
    auVar44._0_4_ = fVar150 * (float)local_5a0._0_4_;
    auVar44._8_4_ = fVar158 * fStack_598;
    auVar44._12_4_ = fVar161 * fStack_594;
    auVar44._16_4_ = fStack_590 * 0.0;
    auVar44._20_4_ = fStack_58c * 0.0;
    auVar44._24_4_ = fStack_588 * 0.0;
    auVar44._28_4_ = uStack_584;
    fVar151 = auVar22._0_4_;
    auVar154._0_4_ = fVar152 * fVar151;
    fVar162 = auVar22._4_4_;
    auVar154._4_4_ = fVar152 * fVar162;
    fVar168 = auVar22._8_4_;
    auVar154._8_4_ = fVar152 * fVar168;
    fVar193 = auVar22._12_4_;
    auVar154._12_4_ = fVar152 * fVar193;
    auVar154._16_4_ = fVar152 * 0.0;
    auVar154._20_4_ = fVar152 * 0.0;
    auVar154._24_4_ = fVar152 * 0.0;
    auVar154._28_4_ = 0;
    auVar88 = vsubps_avx(auVar42,auVar154);
    auVar45._4_4_ = fVar157 * fVar162;
    auVar45._0_4_ = fVar157 * fVar151;
    auVar45._8_4_ = fVar157 * fVar168;
    auVar45._12_4_ = fVar157 * fVar193;
    auVar45._16_4_ = fVar157 * 0.0;
    auVar45._20_4_ = fVar157 * 0.0;
    auVar45._24_4_ = fVar157 * 0.0;
    auVar45._28_4_ = 0;
    auVar112 = vsubps_avx(auVar43,auVar45);
    auVar46._4_4_ = local_3c0 * fVar162;
    auVar46._0_4_ = local_3c0 * fVar151;
    auVar46._8_4_ = local_3c0 * fVar168;
    auVar46._12_4_ = local_3c0 * fVar193;
    auVar46._16_4_ = local_3c0 * 0.0;
    auVar46._20_4_ = local_3c0 * 0.0;
    auVar46._24_4_ = local_3c0 * 0.0;
    auVar46._28_4_ = 0;
    auVar16 = vsubps_avx(auVar44,auVar46);
    auVar47._4_4_ = auVar16._4_4_ * auVar16._4_4_;
    auVar47._0_4_ = auVar16._0_4_ * auVar16._0_4_;
    auVar47._8_4_ = auVar16._8_4_ * auVar16._8_4_;
    auVar47._12_4_ = auVar16._12_4_ * auVar16._12_4_;
    auVar47._16_4_ = auVar16._16_4_ * auVar16._16_4_;
    auVar47._20_4_ = auVar16._20_4_ * auVar16._20_4_;
    auVar47._24_4_ = auVar16._24_4_ * auVar16._24_4_;
    auVar47._28_4_ = auVar16._28_4_;
    auVar22 = vfmadd231ps_fma(auVar47,auVar112,auVar112);
    auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar88,auVar88);
    local_540._0_4_ = auVar83._0_4_;
    local_540._4_4_ = auVar83._4_4_;
    fStack_538 = auVar83._8_4_;
    fStack_534 = auVar83._12_4_;
    fStack_530 = auVar83._16_4_;
    fStack_52c = auVar83._20_4_;
    fStack_528 = auVar83._24_4_;
    auVar48._4_4_ = fVar127 * (float)local_540._4_4_ * (float)local_540._4_4_;
    auVar48._0_4_ = fVar119 * (float)local_540._0_4_ * (float)local_540._0_4_;
    auVar48._8_4_ = fVar128 * fStack_538 * fStack_538;
    auVar48._12_4_ = fVar129 * fStack_534 * fStack_534;
    auVar48._16_4_ = fStack_530 * fStack_530 * 0.0;
    auVar48._20_4_ = fStack_52c * fStack_52c * 0.0;
    auVar48._24_4_ = fStack_528 * fStack_528 * 0.0;
    auVar48._28_4_ = auVar112._28_4_;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar98._4_4_ = uVar1;
    auVar98._0_4_ = uVar1;
    auVar98._8_4_ = uVar1;
    auVar98._12_4_ = uVar1;
    auVar98._16_4_ = uVar1;
    auVar98._20_4_ = uVar1;
    auVar98._24_4_ = uVar1;
    auVar98._28_4_ = uVar1;
    auVar88 = vcmpps_avx(ZEXT1632(auVar22),auVar48,1);
    auVar22 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    auVar21 = vpand_avx(auVar22,auVar21);
    auVar85._0_4_ = auVar20._0_4_ * -fVar151;
    auVar85._4_4_ = auVar20._4_4_ * -fVar162;
    auVar85._8_4_ = auVar20._8_4_ * -fVar168;
    auVar85._12_4_ = auVar20._12_4_ * -fVar193;
    auVar85._16_4_ = 0x80000000;
    auVar85._20_4_ = 0x80000000;
    auVar85._24_4_ = 0x80000000;
    auVar85._28_4_ = 0;
    auVar21 = vpand_avx(auVar71,auVar21);
    auVar88 = vpmovsxwd_avx2(auVar21);
    auVar88 = vblendvps_avx(auVar192,auVar85,auVar88);
    auVar17 = vminps_avx(local_5e0,auVar88);
    auVar112 = vmaxps_avx(local_5e0,auVar88);
    auVar87 = vminps_avx(local_500,auVar17);
    auVar16 = vcmpps_avx(auVar87,auVar17,0);
    auVar88 = vcmpps_avx(auVar192,auVar112,0);
    auVar77._8_4_ = 0xff800000;
    auVar77._0_8_ = 0xff800000ff800000;
    auVar77._12_4_ = 0xff800000;
    auVar77._16_4_ = 0xff800000;
    auVar77._20_4_ = 0xff800000;
    auVar77._24_4_ = 0xff800000;
    auVar77._28_4_ = 0xff800000;
    auVar88 = vblendvps_avx(auVar112,auVar77,auVar88);
    auVar112 = vcmpps_avx(auVar192,auVar17,0);
    auVar112 = vblendvps_avx(auVar17,auVar77,auVar112);
    auVar88 = vblendvps_avx(auVar112,auVar88,auVar16);
    local_80 = vmaxps_avx(local_560,auVar88);
    auVar111._0_4_ = fVar171 + auVar87._0_4_;
    auVar111._4_4_ = fVar173 + auVar87._4_4_;
    auVar111._8_4_ = fVar174 + auVar87._8_4_;
    auVar111._12_4_ = fVar175 + auVar87._12_4_;
    auVar111._16_4_ = auVar87._16_4_ + 0.0;
    auVar111._20_4_ = auVar87._20_4_ + 0.0;
    auVar111._24_4_ = auVar87._24_4_ + 0.0;
    auVar111._28_4_ = in_register_0000149c + auVar87._28_4_;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar124._4_4_ = uVar1;
    auVar124._0_4_ = uVar1;
    auVar124._8_4_ = uVar1;
    auVar124._12_4_ = uVar1;
    auVar124._16_4_ = uVar1;
    auVar124._20_4_ = uVar1;
    auVar124._24_4_ = uVar1;
    auVar124._28_4_ = uVar1;
    auVar88 = vcmpps_avx(auVar98,auVar111,2);
    auVar112 = vcmpps_avx(auVar111,auVar124,2);
    auVar88 = vandps_avx(auVar88,auVar112);
    auVar112 = vcmpps_avx(auVar192,auVar87,4);
    auVar88 = vandps_avx(auVar88,auVar112);
    auVar21 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    local_520 = vpand_avx(auVar71,auVar21);
    local_540._0_4_ = fVar171 + local_80._0_4_;
    local_540._4_4_ = fVar173 + local_80._4_4_;
    fStack_538 = fVar174 + local_80._8_4_;
    fStack_534 = fVar175 + local_80._12_4_;
    fStack_530 = local_80._16_4_ + 0.0;
    fStack_52c = local_80._20_4_ + 0.0;
    fStack_528 = local_80._24_4_ + 0.0;
    register0x000012dc = in_register_0000149c + local_80._28_4_;
    auVar88 = vcmpps_avx(auVar98,_local_540,2);
    auVar112 = vcmpps_avx(_local_540,auVar124,2);
    auVar88 = vandps_avx(auVar88,auVar112);
    auVar99._8_4_ = 0xff800000;
    auVar99._0_8_ = 0xff800000ff800000;
    auVar99._12_4_ = 0xff800000;
    auVar99._16_4_ = 0xff800000;
    auVar99._20_4_ = 0xff800000;
    auVar99._24_4_ = 0xff800000;
    auVar99._28_4_ = 0xff800000;
    auVar112 = vcmpps_avx(local_80,auVar99,4);
    auVar88 = vandps_avx(auVar88,auVar112);
    auVar21 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
    local_3e0 = vpand_avx(auVar71,auVar21);
    auVar21 = vpor_avx(local_520,local_3e0);
    auVar88 = vpmovsxwd_avx2(auVar21);
    if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar88 >> 0x7f,0) != '\0') ||
          (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar88 >> 0xbf,0) != '\0') ||
        (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar88[0x1f] < '\0')
    {
      auStack_510 = auVar96._16_16_;
      auVar88 = vpmovzxwd_avx2(local_520);
      auVar112 = vpslld_avx2(auVar88,0x1f);
      auVar88 = vblendvps_avx(local_80,auVar87,auVar112);
      auVar112 = vblendvps_avx(local_4c0,auVar75,auVar112);
      auVar87 = vrcpps_avx(auVar117);
      auVar178._8_4_ = 0x3f800000;
      auVar178._0_8_ = &DAT_3f8000003f800000;
      auVar178._12_4_ = 0x3f800000;
      auVar178._16_4_ = 0x3f800000;
      auVar178._20_4_ = 0x3f800000;
      auVar178._24_4_ = 0x3f800000;
      auVar178._28_4_ = 0x3f800000;
      auVar22 = vfnmadd213ps_fma(auVar87,auVar117,auVar178);
      auVar20 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar87,auVar87);
      fVar82 = fVar160 * fVar147 * fVar82;
      fVar89 = fVar163 * fVar159 * fVar89;
      fVar90 = fVar165 * fVar166 * fVar90;
      fVar91 = fVar167 * fVar176 * fVar91;
      fVar92 = fVar195 * 0.0 * fVar92;
      fVar93 = fVar197 * 0.0 * fVar93;
      fVar94 = fVar182 * 0.0 * fVar94;
      local_5c0 = local_2a0._0_4_ * fVar82;
      fStack_5bc = local_2a0._4_4_ * fVar89;
      fVar182 = local_2a0._8_4_;
      fVar95 = local_2a0._12_4_;
      fVar103 = local_2a0._16_4_;
      fVar105 = local_2a0._20_4_;
      fVar107 = local_2a0._24_4_;
      local_420 = local_480._0_4_ * fVar82;
      fStack_41c = local_480._4_4_ * fVar89;
      fVar187 = local_480._8_4_;
      fVar102 = local_480._12_4_;
      fVar104 = local_480._16_4_;
      fVar106 = local_480._20_4_;
      fVar119 = local_480._24_4_;
      local_440 = local_2a0._0_4_ * local_400;
      fStack_43c = local_2a0._4_4_ * fStack_3fc;
      auVar16 = vcmpps_avx(auVar88,local_500,0);
      auVar17 = vcmpps_avx(auVar88,local_560,0);
      auVar16 = vorps_avx(auVar16,auVar17);
      auVar22 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
      auVar23 = vpand_avx(auVar22,auVar71);
      auVar16 = vcmpps_avx(local_5e0,auVar88,0);
      auVar22 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
      auVar71 = vpand_avx(auVar22,auVar71);
      fVar160 = auVar88._0_4_;
      fVar165 = auVar88._4_4_;
      fVar147 = auVar88._8_4_;
      fVar159 = auVar88._12_4_;
      fVar166 = auVar88._16_4_;
      fVar176 = auVar88._20_4_;
      fVar195 = auVar88._24_4_;
      fStack_5b8 = fVar182 * fVar90;
      fStack_5b4 = fVar95 * fVar91;
      fStack_5b0 = fVar103 * fVar92;
      fStack_5ac = fVar105 * fVar93;
      fStack_5a8 = fVar107 * fVar94;
      fStack_5a4 = local_3c0;
      auVar134._0_4_ = local_5c0 + fVar108 * (fVar152 * fVar160 + (float)local_620._0_4_);
      auVar134._4_4_ = fStack_5bc + fVar114 * (fVar152 * fVar165 + (float)local_620._4_4_);
      auVar134._8_4_ = fVar182 * fVar90 + fVar115 * (fVar152 * fVar147 + fStack_618);
      auVar134._12_4_ = fVar95 * fVar91 + fVar116 * (fVar152 * fVar159 + fStack_614);
      auVar134._16_4_ = fVar103 * fVar92 + (fVar152 * fVar166 + fStack_610) * 0.0;
      auVar134._20_4_ = fVar105 * fVar93 + (fVar152 * fVar176 + fStack_60c) * 0.0;
      auVar134._24_4_ = fVar107 * fVar94 + (fVar152 * fVar195 + fStack_608) * 0.0;
      auVar134._28_4_ = local_3c0 + fVar149 + 0.0;
      fStack_438 = fVar182 * fStack_3f8;
      fStack_434 = fVar95 * fStack_3f4;
      fStack_430 = fVar103 * fStack_3f0;
      fStack_42c = fVar105 * fStack_3ec;
      fStack_428 = fVar107 * fStack_3e8;
      uStack_424 = 0x3f800000;
      fVar163 = auVar112._0_4_;
      fVar167 = auVar112._4_4_;
      auVar49._4_4_ = fStack_43c * fVar167;
      auVar49._0_4_ = local_440 * fVar163;
      fVar151 = auVar112._8_4_;
      auVar49._8_4_ = fVar182 * fStack_3f8 * fVar151;
      fVar162 = auVar112._12_4_;
      auVar49._12_4_ = fVar95 * fStack_3f4 * fVar162;
      fVar168 = auVar112._16_4_;
      auVar49._16_4_ = fVar103 * fStack_3f0 * fVar168;
      fVar193 = auVar112._20_4_;
      auVar49._20_4_ = fVar105 * fStack_3ec * fVar193;
      fVar197 = auVar112._24_4_;
      auVar49._24_4_ = fVar107 * fStack_3e8 * fVar197;
      auVar49._28_4_ = fVar152;
      auVar16 = vsubps_avx(auVar134,auVar49);
      fStack_418 = fVar187 * fVar90;
      fStack_414 = fVar102 * fVar91;
      fStack_410 = fVar104 * fVar92;
      fStack_40c = fVar106 * fVar93;
      fStack_408 = fVar119 * fVar94;
      fStack_404 = in_register_0000149c;
      auVar146._0_4_ = local_420 + fVar108 * (fVar160 * fVar157 + (float)local_4e0._0_4_);
      auVar146._4_4_ = fStack_41c + fVar114 * (fVar165 * fVar157 + (float)local_4e0._4_4_);
      auVar146._8_4_ = fVar187 * fVar90 + fVar115 * (fVar147 * fVar157 + fStack_4d8);
      auVar146._12_4_ = fVar102 * fVar91 + fVar116 * (fVar159 * fVar157 + fStack_4d4);
      auVar146._16_4_ = fVar104 * fVar92 + (fVar166 * fVar157 + fStack_4d0) * 0.0;
      auVar146._20_4_ = fVar106 * fVar93 + (fVar176 * fVar157 + fStack_4cc) * 0.0;
      auVar146._24_4_ = fVar119 * fVar94 + (fVar195 * fVar157 + fStack_4c8) * 0.0;
      auVar146._28_4_ = in_register_0000149c + fVar152 + fStack_4c4;
      local_a0 = local_480._0_4_ * local_400;
      fStack_9c = local_480._4_4_ * fStack_3fc;
      fStack_98 = fVar187 * fStack_3f8;
      fStack_94 = fVar102 * fStack_3f4;
      fStack_90 = fVar104 * fStack_3f0;
      fStack_8c = fVar106 * fStack_3ec;
      fStack_88 = fVar119 * fStack_3e8;
      fStack_84 = local_3c0;
      auVar50._4_4_ = fVar167 * fStack_9c;
      auVar50._0_4_ = fVar163 * local_a0;
      auVar50._8_4_ = fVar151 * fVar187 * fStack_3f8;
      auVar50._12_4_ = fVar162 * fVar102 * fStack_3f4;
      auVar50._16_4_ = fVar168 * fVar104 * fStack_3f0;
      auVar50._20_4_ = fVar193 * fVar106 * fStack_3ec;
      auVar50._24_4_ = fVar197 * fVar119 * fStack_3e8;
      auVar50._28_4_ = in_register_0000149c;
      auVar17 = vsubps_avx(auVar146,auVar50);
      auVar117 = vpmovsxwd_avx2(auVar23);
      auVar72 = vpmovsxwd_avx2(auVar71);
      local_100._0_8_ = local_2a0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar182;
      local_100._12_4_ = -fVar95;
      local_100._16_4_ = -fVar103;
      local_100._20_4_ = -fVar105;
      local_100._24_4_ = -fVar107;
      local_100._28_4_ = local_2a0._28_4_ ^ 0x80000000;
      auVar112 = vblendvps_avx(local_2a0,local_100,auVar72);
      local_320 = vblendvps_avx(auVar112,auVar16,auVar117);
      auVar136 = ZEXT3264(local_320);
      fStack_a4 = auVar112._28_4_;
      local_400 = fVar169 * local_400;
      fStack_3fc = fVar156 * fStack_3fc;
      fStack_3f8 = fVar164 * fStack_3f8;
      fStack_3f4 = fVar170 * fStack_3f4;
      fStack_3f0 = fVar194 * fStack_3f0;
      fStack_3ec = fVar196 * fStack_3ec;
      fStack_3e8 = fVar198 * fStack_3e8;
      local_c0 = fVar169 * fVar82;
      fStack_bc = fVar156 * fVar89;
      fStack_b8 = fVar164 * fVar90;
      fStack_b4 = fVar170 * fVar91;
      fStack_b0 = fVar194 * fVar92;
      fStack_ac = fVar196 * fVar93;
      fStack_a8 = fVar198 * fVar94;
      auVar86._0_4_ = fVar169 * fVar82 + fVar108 * (fVar181 + fVar160 * local_3c0);
      auVar86._4_4_ = fVar156 * fVar89 + fVar114 * (fVar184 + fVar165 * local_3c0);
      auVar86._8_4_ = fVar164 * fVar90 + fVar115 * (fVar186 + fVar147 * local_3c0);
      auVar86._12_4_ = fVar170 * fVar91 + fVar116 * (fVar188 + fVar159 * local_3c0);
      auVar86._16_4_ = fVar194 * fVar92 + (fVar189 + fVar166 * local_3c0) * 0.0;
      auVar86._20_4_ = fVar196 * fVar93 + (fVar190 + fVar176 * local_3c0) * 0.0;
      auVar86._24_4_ = fVar198 * fVar94 + (fVar191 + fVar195 * local_3c0) * 0.0;
      auVar86._28_4_ = fStack_a4 + fStack_444 + auVar87._28_4_;
      auVar51._4_4_ = fVar167 * fStack_3fc;
      auVar51._0_4_ = fVar163 * local_400;
      auVar51._8_4_ = fVar151 * fStack_3f8;
      auVar51._12_4_ = fVar162 * fStack_3f4;
      auVar51._16_4_ = fVar168 * fStack_3f0;
      auVar51._20_4_ = fVar193 * fStack_3ec;
      auVar51._24_4_ = fVar197 * fStack_3e8;
      auVar51._28_4_ = fStack_a4;
      local_120._0_8_ = local_480._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar187;
      local_120._12_4_ = -fVar102;
      local_120._16_4_ = -fVar104;
      local_120._20_4_ = -fVar106;
      local_120._24_4_ = -fVar119;
      local_120._28_4_ = local_480._28_4_ ^ 0x80000000;
      auVar112 = vblendvps_avx(local_480,local_120,auVar72);
      auVar16 = vsubps_avx(auVar86,auVar51);
      local_300 = vblendvps_avx(auVar112,auVar17,auVar117);
      local_140._0_8_ = local_4a0._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar164;
      local_140._12_4_ = -fVar170;
      local_140._16_4_ = -fVar194;
      local_140._20_4_ = -fVar196;
      local_140._24_4_ = -fVar198;
      local_140._28_4_ = -fVar185;
      auVar112 = vblendvps_avx(local_4a0,local_140,auVar72);
      local_2e0 = vblendvps_avx(auVar112,auVar16,auVar117);
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = &DAT_3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar78._16_4_ = 0x3f800000;
      auVar78._20_4_ = 0x3f800000;
      auVar78._24_4_ = 0x3f800000;
      auVar78._28_4_ = 0x3f800000;
      local_e0 = vandnps_avx(auVar72,auVar78);
      _local_5a0 = ZEXT1632(auVar20);
      auVar52._4_4_ = fVar167 * auVar20._4_4_;
      auVar52._0_4_ = fVar163 * auVar20._0_4_;
      auVar52._8_4_ = fVar151 * auVar20._8_4_;
      auVar52._12_4_ = fVar162 * auVar20._12_4_;
      auVar52._16_4_ = fVar168 * 0.0;
      auVar52._20_4_ = fVar193 * 0.0;
      auVar52._24_4_ = fVar197 * 0.0;
      auVar52._28_4_ = auVar72._28_4_;
      local_380 = vblendvps_avx(local_e0,auVar52,auVar117);
      local_340._0_4_ = fVar160 + fVar171;
      local_340._4_4_ = fVar165 + fVar173;
      local_340._8_4_ = fVar147 + fVar174;
      local_340._12_4_ = fVar159 + fVar175;
      local_340._16_4_ = fVar166 + 0.0;
      local_340._20_4_ = fVar176 + 0.0;
      local_340._24_4_ = fVar195 + 0.0;
      local_340._28_4_ = auVar88._28_4_ + in_register_0000149c;
      local_360 = ZEXT832(0) << 0x20;
      auVar71 = vpsllw_avx(auVar21,0xf);
      auVar71 = vpacksswb_avx(auVar71,auVar71);
      uVar67 = (ulong)(byte)(SUB161(auVar71 >> 7,0) & 1 | (SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar71 >> 0x37,0) & 1) << 6 | SUB161(auVar71 >> 0x3f,0) << 7);
      iVar65 = 1 << ((uint)k & 0x1f);
      auVar79._4_4_ = iVar65;
      auVar79._0_4_ = iVar65;
      auVar79._8_4_ = iVar65;
      auVar79._12_4_ = iVar65;
      auVar79._16_4_ = iVar65;
      auVar79._20_4_ = iVar65;
      auVar79._24_4_ = iVar65;
      auVar79._28_4_ = iVar65;
      auVar112 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar113 = ZEXT3264(auVar112);
      auVar88 = vpand_avx2(auVar79,auVar112);
      auVar88 = vpcmpeqd_avx2(auVar88,auVar112);
      auVar126 = ZEXT3264(auVar88);
      auVar142 = ZEXT3264(local_480);
      auVar118 = ZEXT3264(local_4a0);
      auVar177 = ZEXT3264(local_560);
      auVar180 = ZEXT3264(_local_540);
      fVar152 = (float)local_620._0_4_;
      fVar160 = (float)local_620._4_4_;
      fVar163 = fStack_618;
      fVar165 = fStack_614;
      fVar167 = fStack_610;
      fVar169 = fStack_60c;
      fVar147 = fStack_608;
      fVar151 = (float)local_4e0._0_4_;
      fVar156 = (float)local_4e0._4_4_;
      fVar159 = fStack_4d8;
      fVar162 = fStack_4d4;
      fVar164 = fStack_4d0;
      fVar166 = fStack_4cc;
      fVar168 = fStack_4c8;
      fVar170 = fStack_4c4;
      fVar176 = fStack_444;
      fVar193 = fVar157;
      fVar194 = fVar157;
      fVar195 = fVar157;
      fVar196 = fVar157;
      fVar197 = fVar157;
      fVar198 = fVar157;
      uStack_3e4 = local_100._28_4_;
      fStack_3bc = local_3c0;
      fStack_3b8 = local_3c0;
      fStack_3b4 = local_3c0;
      fStack_3b0 = local_3c0;
      fStack_3ac = local_3c0;
      fStack_3a8 = local_3c0;
      fStack_3a4 = local_3c0;
      do {
        local_670.hit = local_260;
        local_670.valid = (int *)local_640;
        uVar19 = 0;
        for (uVar66 = uVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
          uVar19 = uVar19 + 1;
        }
        uVar5 = local_280[uVar19];
        pGVar13 = (pSVar68->geometries).items[uVar5].ptr;
        local_670.ray = (RTCRayN *)ray;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar67 = uVar67 ^ 1L << (uVar19 & 0x3f);
          bVar69 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar69 = false;
        }
        else {
          uVar66 = (ulong)(uint)((int)uVar19 * 4);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_200 = *(undefined4 *)(local_380 + uVar66);
          local_1e0._4_4_ = *(undefined4 *)(local_360 + uVar66);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar66);
          local_670.context = context->user;
          local_1c0._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar66);
          uVar2 = *(undefined4 *)(local_320 + uVar66);
          local_640 = auVar126._0_32_;
          local_240._4_4_ = *(undefined4 *)(local_300 + uVar66);
          uVar172 = *(undefined4 *)(local_2e0 + uVar66);
          local_220._4_4_ = uVar172;
          local_220._0_4_ = uVar172;
          local_220._8_4_ = uVar172;
          local_220._12_4_ = uVar172;
          local_220._16_4_ = uVar172;
          local_220._20_4_ = uVar172;
          local_220._24_4_ = uVar172;
          local_220._28_4_ = uVar172;
          local_1a0._4_4_ = uVar5;
          local_1a0._0_4_ = uVar5;
          local_1a0._8_4_ = uVar5;
          local_1a0._12_4_ = uVar5;
          local_1a0._16_4_ = uVar5;
          local_1a0._20_4_ = uVar5;
          local_1a0._24_4_ = uVar5;
          local_1a0._28_4_ = uVar5;
          local_260[0] = (RTCHitN)(char)uVar2;
          local_260[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[4] = (RTCHitN)(char)uVar2;
          local_260[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[8] = (RTCHitN)(char)uVar2;
          local_260[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[0xc] = (RTCHitN)(char)uVar2;
          local_260[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[0x10] = (RTCHitN)(char)uVar2;
          local_260[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[0x14] = (RTCHitN)(char)uVar2;
          local_260[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[0x18] = (RTCHitN)(char)uVar2;
          local_260[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_260[0x1c] = (RTCHitN)(char)uVar2;
          local_260[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_260[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_260[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_240._0_4_ = local_240._4_4_;
          local_240._8_4_ = local_240._4_4_;
          local_240._12_4_ = local_240._4_4_;
          local_240._16_4_ = local_240._4_4_;
          local_240._20_4_ = local_240._4_4_;
          local_240._24_4_ = local_240._4_4_;
          local_240._28_4_ = local_240._4_4_;
          auVar88 = vpcmpeqd_avx2(local_220,local_220);
          uStack_1fc = local_200;
          uStack_1f8 = local_200;
          uStack_1f4 = local_200;
          uStack_1f0 = local_200;
          uStack_1ec = local_200;
          uStack_1e8 = local_200;
          uStack_1e4 = local_200;
          local_1e0._0_4_ = local_1e0._4_4_;
          local_1e0._8_4_ = local_1e0._4_4_;
          local_1e0._12_4_ = local_1e0._4_4_;
          local_1e0._16_4_ = local_1e0._4_4_;
          local_1e0._20_4_ = local_1e0._4_4_;
          local_1e0._24_4_ = local_1e0._4_4_;
          local_1e0._28_4_ = local_1e0._4_4_;
          local_1c0._0_4_ = local_1c0._4_4_;
          local_1c0._8_4_ = local_1c0._4_4_;
          local_1c0._12_4_ = local_1c0._4_4_;
          local_1c0._16_4_ = local_1c0._4_4_;
          local_1c0._20_4_ = local_1c0._4_4_;
          local_1c0._24_4_ = local_1c0._4_4_;
          local_1c0._28_4_ = local_1c0._4_4_;
          uStack_17c = (local_670.context)->instID[0];
          local_180 = uStack_17c;
          uStack_178 = uStack_17c;
          uStack_174 = uStack_17c;
          uStack_170 = uStack_17c;
          uStack_16c = uStack_17c;
          uStack_168 = uStack_17c;
          uStack_164 = uStack_17c;
          uStack_15c = (local_670.context)->instPrimID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          local_670.geometryUserPtr = pGVar13->userPtr;
          local_670.N = 8;
          _local_580 = local_640;
          if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar88 = ZEXT1632(auVar88._0_16_);
            (*pGVar13->occlusionFilterN)(&local_670);
            auVar88 = vpcmpeqd_avx2(auVar88,auVar88);
            auVar180 = ZEXT3264(_local_540);
            auVar177 = ZEXT3264(local_560);
            auVar118 = ZEXT3264(local_4a0);
            auVar142 = ZEXT3264(local_480);
            fVar152 = (float)local_620._0_4_;
            fVar160 = (float)local_620._4_4_;
            fVar163 = fStack_618;
            fVar165 = fStack_614;
            fVar167 = fStack_610;
            fVar169 = fStack_60c;
            fVar147 = fStack_608;
            fVar149 = fStack_604;
            fVar151 = (float)local_4e0._0_4_;
            fVar156 = (float)local_4e0._4_4_;
            fVar159 = fStack_4d8;
            fVar162 = fStack_4d4;
            fVar164 = fStack_4d0;
            fVar166 = fStack_4cc;
            fVar168 = fStack_4c8;
            fVar170 = fStack_4c4;
            fVar181 = (float)local_460._0_4_;
            fVar184 = (float)local_460._4_4_;
            fVar186 = fStack_458;
            fVar188 = fStack_454;
            fVar189 = fStack_450;
            fVar190 = fStack_44c;
            fVar191 = fStack_448;
            fVar176 = fStack_444;
            fVar157 = (float)local_600._0_4_;
            fVar193 = (float)local_600._4_4_;
            fVar194 = fStack_5f8;
            fVar195 = fStack_5f4;
            fVar196 = fStack_5f0;
            fVar197 = fStack_5ec;
            fVar198 = fStack_5e8;
          }
          auVar136 = ZEXT3264(auVar88);
          auVar126 = ZEXT3264(_local_580);
          auVar87 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar16 = vpcmpeqd_avx2(auVar87,local_640);
          auVar112 = auVar88 & ~auVar16;
          auVar17 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
          auVar113 = ZEXT3264(auVar17);
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0x7f,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0xbf,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar112[0x1f]) {
            auVar16 = auVar16 ^ auVar88;
          }
          else {
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              auVar88 = ZEXT1632(auVar88._0_16_);
              (*p_Var15)(&local_670);
              auVar88 = vpcmpeqd_avx2(auVar88,auVar88);
              auVar136 = ZEXT3264(auVar88);
              auVar126 = ZEXT3264(_local_580);
              auVar87 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar180 = ZEXT3264(_local_540);
              auVar177 = ZEXT3264(local_560);
              auVar88 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
              auVar113 = ZEXT3264(auVar88);
              auVar118 = ZEXT3264(local_4a0);
              auVar142 = ZEXT3264(local_480);
              fVar152 = (float)local_620._0_4_;
              fVar160 = (float)local_620._4_4_;
              fVar163 = fStack_618;
              fVar165 = fStack_614;
              fVar167 = fStack_610;
              fVar169 = fStack_60c;
              fVar147 = fStack_608;
              fVar149 = fStack_604;
              fVar151 = (float)local_4e0._0_4_;
              fVar156 = (float)local_4e0._4_4_;
              fVar159 = fStack_4d8;
              fVar162 = fStack_4d4;
              fVar164 = fStack_4d0;
              fVar166 = fStack_4cc;
              fVar168 = fStack_4c8;
              fVar170 = fStack_4c4;
              fVar181 = (float)local_460._0_4_;
              fVar184 = (float)local_460._4_4_;
              fVar186 = fStack_458;
              fVar188 = fStack_454;
              fVar189 = fStack_450;
              fVar190 = fStack_44c;
              fVar191 = fStack_448;
              fVar176 = fStack_444;
              fVar157 = (float)local_600._0_4_;
              fVar193 = (float)local_600._4_4_;
              fVar194 = fStack_5f8;
              fVar195 = fStack_5f4;
              fVar196 = fStack_5f0;
              fVar197 = fStack_5ec;
              fVar198 = fStack_5e8;
            }
            auVar88 = vpcmpeqd_avx2(auVar87,local_640);
            auVar16 = auVar88 ^ auVar136._0_32_;
            auVar100._8_4_ = 0xff800000;
            auVar100._0_8_ = 0xff800000ff800000;
            auVar100._12_4_ = 0xff800000;
            auVar100._16_4_ = 0xff800000;
            auVar100._20_4_ = 0xff800000;
            auVar100._24_4_ = 0xff800000;
            auVar100._28_4_ = 0xff800000;
            auVar88 = vblendvps_avx(auVar100,*(undefined1 (*) [32])(local_670.ray + 0x100),auVar88);
            *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar88;
          }
          bVar62 = (auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar63 = (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar61 = (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar60 = SUB321(auVar16 >> 0x7f,0) == '\0';
          bVar59 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar58 = SUB321(auVar16 >> 0xbf,0) == '\0';
          bVar57 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar70 = -1 < auVar16[0x1f];
          bVar69 = ((((((bVar62 && bVar63) && bVar61) && bVar60) && bVar59) && bVar58) && bVar57) &&
                   bVar70;
          if (((((((bVar62 && bVar63) && bVar61) && bVar60) && bVar59) && bVar58) && bVar57) &&
              bVar70) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            uVar67 = uVar67 ^ 1L << (uVar19 & 0x3f);
          }
        }
      } while ((uVar67 != 0) && (bVar69 != false));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar80._4_4_ = uVar1;
      auVar80._0_4_ = uVar1;
      auVar80._8_4_ = uVar1;
      auVar80._12_4_ = uVar1;
      auVar80._16_4_ = uVar1;
      auVar80._20_4_ = uVar1;
      auVar80._24_4_ = uVar1;
      auVar80._28_4_ = uVar1;
      auVar21 = vpand_avx(local_3e0,local_520);
      auVar88 = vcmpps_avx(auVar180._0_32_,auVar80,2);
      auVar71 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
      auVar71 = vpand_avx(auVar71,auVar21);
      auVar88 = vpmovzxwd_avx2(auVar71);
      auVar88 = vpslld_avx2(auVar88,0x1f);
      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar88 >> 0x7f,0) == '\0') &&
            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar88 >> 0xbf,0) == '\0') &&
          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar88[0x1f])
      {
        return (bool)(bVar69 ^ 1U);
      }
      auVar16 = vcmpps_avx(local_80,local_5e0,0);
      auVar88 = vblendvps_avx(local_2a0,local_100,auVar16);
      auVar112 = vblendvps_avx(auVar142._0_32_,local_120,auVar16);
      auVar16 = vblendvps_avx(auVar118._0_32_,local_140,auVar16);
      auVar17 = vcmpps_avx(local_80,local_500,0);
      auVar87 = vcmpps_avx(local_80,auVar177._0_32_,0);
      auVar17 = vorps_avx(auVar17,auVar87);
      fVar182 = local_80._0_4_;
      fVar185 = local_80._4_4_;
      fVar187 = local_80._8_4_;
      fVar82 = local_80._12_4_;
      fVar89 = local_80._16_4_;
      fVar90 = local_80._20_4_;
      fVar91 = local_80._24_4_;
      auVar125._0_4_ =
           (float)local_2c0._0_4_ * (fVar152 + fVar182 * (float)local_3a0._0_4_) + local_5c0;
      auVar125._4_4_ =
           (float)local_2c0._4_4_ * (fVar160 + fVar185 * (float)local_3a0._4_4_) + fStack_5bc;
      auVar125._8_4_ = fStack_2b8 * (fVar163 + fVar187 * fStack_398) + fStack_5b8;
      auVar125._12_4_ = fStack_2b4 * (fVar165 + fVar82 * fStack_394) + fStack_5b4;
      auVar125._16_4_ = fStack_2b0 * (fVar167 + fVar89 * fStack_390) + fStack_5b0;
      auVar125._20_4_ = fStack_2ac * (fVar169 + fVar90 * fStack_38c) + fStack_5ac;
      auVar125._24_4_ = fStack_2a8 * (fVar147 + fVar91 * fStack_388) + fStack_5a8;
      auVar125._28_4_ = fVar149 + auVar87._28_4_ + fStack_5a4;
      auVar135._0_4_ = (float)local_2c0._0_4_ * (fVar151 + fVar157 * fVar182) + local_420;
      auVar135._4_4_ = (float)local_2c0._4_4_ * (fVar156 + fVar193 * fVar185) + fStack_41c;
      auVar135._8_4_ = fStack_2b8 * (fVar159 + fVar194 * fVar187) + fStack_418;
      auVar135._12_4_ = fStack_2b4 * (fVar162 + fVar195 * fVar82) + fStack_414;
      auVar135._16_4_ = fStack_2b0 * (fVar164 + fVar196 * fVar89) + fStack_410;
      auVar135._20_4_ = fStack_2ac * (fVar166 + fVar197 * fVar90) + fStack_40c;
      auVar135._24_4_ = fStack_2a8 * (fVar168 + fVar198 * fVar91) + fStack_408;
      auVar135._28_4_ = fVar170 + auVar136._28_4_ + fStack_404;
      auVar141._0_4_ = (float)local_2c0._0_4_ * (fVar181 + fVar182 * local_3c0) + local_c0;
      auVar141._4_4_ = (float)local_2c0._4_4_ * (fVar184 + fVar185 * fStack_3bc) + fStack_bc;
      auVar141._8_4_ = fStack_2b8 * (fVar186 + fVar187 * fStack_3b8) + fStack_b8;
      auVar141._12_4_ = fStack_2b4 * (fVar188 + fVar82 * fStack_3b4) + fStack_b4;
      auVar141._16_4_ = fStack_2b0 * (fVar189 + fVar89 * fStack_3b0) + fStack_b0;
      auVar141._20_4_ = fStack_2ac * (fVar190 + fVar90 * fStack_3ac) + fStack_ac;
      auVar141._24_4_ = fStack_2a8 * (fVar191 + fVar91 * fStack_3a8) + fStack_a8;
      auVar141._28_4_ = fVar176 + auVar142._28_4_ + fStack_a4;
      fVar152 = local_4c0._0_4_;
      fVar157 = local_4c0._4_4_;
      auVar53._4_4_ = fVar157 * fStack_43c;
      auVar53._0_4_ = fVar152 * local_440;
      fVar160 = local_4c0._8_4_;
      auVar53._8_4_ = fVar160 * fStack_438;
      fVar163 = local_4c0._12_4_;
      auVar53._12_4_ = fVar163 * fStack_434;
      fVar165 = local_4c0._16_4_;
      auVar53._16_4_ = fVar165 * fStack_430;
      fVar167 = local_4c0._20_4_;
      auVar53._20_4_ = fVar167 * fStack_42c;
      fVar169 = local_4c0._24_4_;
      auVar53._24_4_ = fVar169 * fStack_428;
      auVar53._28_4_ = uStack_2a4;
      auVar87 = vsubps_avx(auVar125,auVar53);
      auVar54._4_4_ = fVar157 * fStack_9c;
      auVar54._0_4_ = fVar152 * local_a0;
      auVar54._8_4_ = fVar160 * fStack_98;
      auVar54._12_4_ = fVar163 * fStack_94;
      auVar54._16_4_ = fVar165 * fStack_90;
      auVar54._20_4_ = fVar167 * fStack_8c;
      auVar54._24_4_ = fVar169 * fStack_88;
      auVar54._28_4_ = uStack_2a4;
      auVar117 = vsubps_avx(auVar135,auVar54);
      auVar55._4_4_ = fVar157 * fStack_3fc;
      auVar55._0_4_ = fVar152 * local_400;
      auVar55._8_4_ = fVar160 * fStack_3f8;
      auVar55._12_4_ = fVar163 * fStack_3f4;
      auVar55._16_4_ = fVar165 * fStack_3f0;
      auVar55._20_4_ = fVar167 * fStack_3ec;
      auVar55._24_4_ = fVar169 * fStack_3e8;
      auVar55._28_4_ = uStack_2a4;
      auVar72 = vsubps_avx(auVar141,auVar55);
      local_320 = vblendvps_avx(auVar88,auVar87,auVar17);
      local_300 = vblendvps_avx(auVar112,auVar117,auVar17);
      local_2e0 = vblendvps_avx(auVar16,auVar72,auVar17);
      auVar56._4_4_ = fVar157 * (float)local_5a0._4_4_;
      auVar56._0_4_ = fVar152 * (float)local_5a0._0_4_;
      auVar56._8_4_ = fVar160 * fStack_598;
      auVar56._12_4_ = fVar163 * fStack_594;
      auVar56._16_4_ = fVar165 * fStack_590;
      auVar56._20_4_ = fVar167 * fStack_58c;
      auVar56._24_4_ = fVar169 * fStack_588;
      auVar56._28_4_ = auVar87._28_4_;
      local_380 = vblendvps_avx(local_e0,auVar56,auVar17);
      auVar118 = ZEXT864(0) << 0x20;
      local_360 = ZEXT832(0) << 0x20;
      local_340 = auVar180._0_32_;
      pSVar68 = context->scene;
      auVar71 = vpsllw_avx(auVar71,0xf);
      auVar71 = vpacksswb_avx(auVar71,auVar71);
      uVar67 = (ulong)(byte)(SUB161(auVar71 >> 7,0) & 1 | (SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar71 >> 0x37,0) & 1) << 6 | SUB161(auVar71 >> 0x3f,0) << 7);
      iVar65 = 1 << ((uint)k & 0x1f);
      auVar81._4_4_ = iVar65;
      auVar81._0_4_ = iVar65;
      auVar81._8_4_ = iVar65;
      auVar81._12_4_ = iVar65;
      auVar81._16_4_ = iVar65;
      auVar81._20_4_ = iVar65;
      auVar81._24_4_ = iVar65;
      auVar81._28_4_ = iVar65;
      auVar88 = vpand_avx2(auVar113._0_32_,auVar81);
      auVar88 = vpcmpeqd_avx2(auVar113._0_32_,auVar88);
      auVar113 = ZEXT3264(auVar88);
      auVar88 = vpcmpeqd_avx2(local_4c0,local_4c0);
      auVar126 = ZEXT3264(auVar88);
      do {
        local_670.hit = local_260;
        local_670.valid = (int *)local_640;
        uVar19 = 0;
        for (uVar66 = uVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
          uVar19 = uVar19 + 1;
        }
        local_1a0._4_4_ = local_280[uVar19];
        pGVar13 = (pSVar68->geometries).items[(uint)local_1a0._4_4_].ptr;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar67 = uVar67 ^ 1L << (uVar19 & 0x3f);
          bVar70 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar70 = false;
        }
        else {
          uVar66 = (ulong)(uint)((int)uVar19 * 4);
          uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_200 = *(undefined4 *)(local_380 + uVar66);
          uVar1 = *(undefined4 *)(local_360 + uVar66);
          local_1e0._4_4_ = uVar1;
          local_1e0._0_4_ = uVar1;
          local_1e0._8_4_ = uVar1;
          local_1e0._12_4_ = uVar1;
          local_1e0._16_4_ = uVar1;
          local_1e0._20_4_ = uVar1;
          local_1e0._24_4_ = uVar1;
          local_1e0._28_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar66);
          local_670.context = context->user;
          uVar1 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar66);
          local_1c0._4_4_ = uVar1;
          local_1c0._0_4_ = uVar1;
          local_1c0._8_4_ = uVar1;
          local_1c0._12_4_ = uVar1;
          local_1c0._16_4_ = uVar1;
          local_1c0._20_4_ = uVar1;
          local_1c0._24_4_ = uVar1;
          local_1c0._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_320 + uVar66);
          uVar2 = *(undefined4 *)(local_300 + uVar66);
          local_240._4_4_ = uVar2;
          local_240._0_4_ = uVar2;
          local_240._8_4_ = uVar2;
          local_240._12_4_ = uVar2;
          local_240._16_4_ = uVar2;
          local_240._20_4_ = uVar2;
          local_240._24_4_ = uVar2;
          local_240._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_2e0 + uVar66);
          local_220._4_4_ = uVar2;
          local_220._0_4_ = uVar2;
          local_220._8_4_ = uVar2;
          local_220._12_4_ = uVar2;
          local_220._16_4_ = uVar2;
          local_220._20_4_ = uVar2;
          local_220._24_4_ = uVar2;
          local_220._28_4_ = uVar2;
          local_260[0] = (RTCHitN)(char)uVar1;
          local_260[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[4] = (RTCHitN)(char)uVar1;
          local_260[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[8] = (RTCHitN)(char)uVar1;
          local_260[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[0xc] = (RTCHitN)(char)uVar1;
          local_260[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[0x10] = (RTCHitN)(char)uVar1;
          local_260[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[0x14] = (RTCHitN)(char)uVar1;
          local_260[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[0x18] = (RTCHitN)(char)uVar1;
          local_260[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_260[0x1c] = (RTCHitN)(char)uVar1;
          local_260[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_260[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_260[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_1fc = local_200;
          uStack_1f8 = local_200;
          uStack_1f4 = local_200;
          uStack_1f0 = local_200;
          uStack_1ec = local_200;
          uStack_1e8 = local_200;
          uStack_1e4 = local_200;
          local_1a0._0_4_ = local_1a0._4_4_;
          local_1a0._8_4_ = local_1a0._4_4_;
          local_1a0._12_4_ = local_1a0._4_4_;
          local_1a0._16_4_ = local_1a0._4_4_;
          local_1a0._20_4_ = local_1a0._4_4_;
          local_1a0._24_4_ = local_1a0._4_4_;
          local_1a0._28_4_ = local_1a0._4_4_;
          uStack_17c = (local_670.context)->instID[0];
          local_180 = uStack_17c;
          uStack_178 = uStack_17c;
          uStack_174 = uStack_17c;
          uStack_170 = uStack_17c;
          uStack_16c = uStack_17c;
          uStack_168 = uStack_17c;
          uStack_164 = uStack_17c;
          uStack_15c = (local_670.context)->instPrimID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          local_640 = auVar113._0_32_;
          local_670.geometryUserPtr = pGVar13->userPtr;
          local_670.N = 8;
          local_670.ray = (RTCRayN *)ray;
          if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_5e0._0_8_ = pSVar68;
            local_620._0_4_ = uVar172;
            auVar88 = ZEXT1632(auVar126._0_16_);
            _local_600 = local_640;
            (*pGVar13->occlusionFilterN)(&local_670);
            auVar88 = vpcmpeqd_avx2(auVar88,auVar88);
            auVar126 = ZEXT3264(auVar88);
            auVar113 = ZEXT3264(_local_600);
            auVar118 = ZEXT1664(ZEXT816(0) << 0x40);
            pSVar68 = (Scene *)local_5e0._0_8_;
            uVar172 = local_620._0_4_;
          }
          auVar112 = vpcmpeqd_avx2(auVar118._0_32_,local_640);
          auVar88 = auVar126._0_32_ & ~auVar112;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0x7f,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar88 >> 0xbf,0) == '\0') &&
              (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar88[0x1f]) {
            auVar112 = auVar126._0_32_ ^ auVar112;
          }
          else {
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              local_5e0._0_8_ = pSVar68;
              _local_600 = auVar113._0_32_;
              local_620._0_4_ = uVar172;
              auVar88 = ZEXT1632(auVar126._0_16_);
              (*p_Var15)(&local_670);
              auVar88 = vpcmpeqd_avx2(auVar88,auVar88);
              auVar126 = ZEXT3264(auVar88);
              auVar113 = ZEXT3264(_local_600);
              auVar118 = ZEXT1664(ZEXT816(0) << 0x40);
              pSVar68 = (Scene *)local_5e0._0_8_;
              uVar172 = local_620._0_4_;
            }
            auVar88 = vpcmpeqd_avx2(auVar118._0_32_,local_640);
            auVar112 = auVar126._0_32_ ^ auVar88;
            auVar101._8_4_ = 0xff800000;
            auVar101._0_8_ = 0xff800000ff800000;
            auVar101._12_4_ = 0xff800000;
            auVar101._16_4_ = 0xff800000;
            auVar101._20_4_ = 0xff800000;
            auVar101._24_4_ = 0xff800000;
            auVar101._28_4_ = 0xff800000;
            auVar88 = vblendvps_avx(auVar101,*(undefined1 (*) [32])(local_670.ray + 0x100),auVar88);
            *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar88;
          }
          bVar63 = (auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar64 = (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar62 = (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar61 = SUB321(auVar112 >> 0x7f,0) == '\0';
          bVar60 = (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar59 = SUB321(auVar112 >> 0xbf,0) == '\0';
          bVar58 = (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar57 = -1 < auVar112[0x1f];
          bVar70 = ((((((bVar63 && bVar64) && bVar62) && bVar61) && bVar60) && bVar59) && bVar58) &&
                   bVar57;
          if (((((((bVar63 && bVar64) && bVar62) && bVar61) && bVar60) && bVar59) && bVar58) &&
              bVar57) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar172;
            uVar67 = uVar67 ^ 1L << (uVar19 & 0x3f);
          }
        }
      } while ((uVar67 != 0) && (bVar70 != false));
      return (bool)(bVar69 ^ 1U | bVar70 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }